

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

TestCase *
Catch::makeTestCase(TestCase *__return_storage_ptr__,ITestCase *_testCase,string *_className,
                   string *_name,string *_descOrTags,SourceLineInfo *_lineInfo)

{
  string *tag_00;
  char cVar1;
  undefined8 _name_00;
  SpecialProperties SVar2;
  size_type *psVar3;
  string *psVar4;
  bool bVar5;
  ulong uVar6;
  bool bVar7;
  undefined1 local_1e0 [8];
  TestCaseInfo info;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  string desc;
  string tag;
  bool local_31;
  
  psVar3 = &info.name._M_string_length;
  local_1e0 = (undefined1  [8])psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"./","");
  tag.field_2._8_8_ = _name;
  local_31 = startsWith(_name,(string *)local_1e0);
  if (local_1e0 != (undefined1  [8])psVar3) {
    operator_delete((void *)local_1e0);
  }
  tags._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&tags;
  tags._M_t._M_impl._0_4_ = 0;
  tags._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tags._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  tags._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  tags._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&desc._M_string_length;
  desc._M_dataplus._M_p = (pointer)0x0;
  desc._M_string_length._0_1_ = 0;
  desc.field_2._8_8_ = &tag._M_string_length;
  tag._M_dataplus._M_p = (pointer)0x0;
  tag._M_string_length._0_1_ = 0;
  tags._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       tags._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (_descOrTags->_M_string_length != 0) {
    bVar7 = false;
    tag_00 = (string *)(&desc.field_2._M_allocated_capacity + 1);
    uVar6 = 0;
    do {
      cVar1 = (_descOrTags->_M_dataplus)._M_p[uVar6];
      if (bVar7) {
        psVar4 = tag_00;
        if (cVar1 == ']') {
          SVar2 = parseSpecialTag(tag_00);
          if (SVar2 == None) {
            enforceNotReservedTag(tag_00,_lineInfo);
            bVar5 = local_31;
          }
          else {
            bVar5 = true;
            if (SVar2 != IsHidden) {
              bVar5 = local_31;
            }
          }
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&info.properties,tag_00);
          tag._M_dataplus._M_p = (pointer)0x0;
          *(undefined1 *)desc.field_2._8_8_ = 0;
          bVar7 = false;
          local_31 = bVar5;
        }
        else {
LAB_00131009:
          std::__cxx11::string::push_back((char)psVar4);
        }
      }
      else {
        psVar4 = (string *)&tags._M_t._M_impl.super__Rb_tree_header._M_node_count;
        if (cVar1 != '[') goto LAB_00131009;
        bVar7 = true;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < _descOrTags->_M_string_length);
  }
  _name_00 = tag.field_2._8_8_;
  psVar3 = &info.name._M_string_length;
  if (local_31 != false) {
    local_1e0 = (undefined1  [8])psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"hide","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&info.properties,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0);
    if (local_1e0 != (undefined1  [8])psVar3) {
      operator_delete((void *)local_1e0);
    }
    local_1e0 = (undefined1  [8])psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,".","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&info.properties,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0);
    if (local_1e0 != (undefined1  [8])psVar3) {
      operator_delete((void *)local_1e0);
    }
  }
  TestCaseInfo::TestCaseInfo
            ((TestCaseInfo *)local_1e0,(string *)_name_00,_className,
             (string *)&tags._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&info.properties,_lineInfo);
  TestCase::TestCase(__return_storage_ptr__,_testCase,(TestCaseInfo *)local_1e0);
  if ((size_type *)info.tagsAsString.field_2._8_8_ != &info.lineInfo.file._M_string_length) {
    operator_delete((void *)info.tagsAsString.field_2._8_8_);
  }
  if ((size_type *)info.lcaseTags._M_t._M_impl.super__Rb_tree_header._M_node_count !=
      &info.tagsAsString._M_string_length) {
    operator_delete((void *)info.lcaseTags._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&info.tags._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&info.description.field_2 + 8));
  if ((size_type *)info.className.field_2._8_8_ != &info.description._M_string_length) {
    operator_delete((void *)info.className.field_2._8_8_);
  }
  if ((size_type *)info.name.field_2._8_8_ != &info.className._M_string_length) {
    operator_delete((void *)info.name.field_2._8_8_);
  }
  if (local_1e0 != (undefined1  [8])psVar3) {
    operator_delete((void *)local_1e0);
  }
  if ((size_type *)desc.field_2._8_8_ != &tag._M_string_length) {
    operator_delete((void *)desc.field_2._8_8_);
  }
  if ((size_type *)tags._M_t._M_impl.super__Rb_tree_header._M_node_count != &desc._M_string_length)
  {
    operator_delete((void *)tags._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&info.properties);
  return __return_storage_ptr__;
}

Assistant:

TestCase makeTestCase(ITestCase* _testCase,
		std::string const& _className,
		std::string const& _name,
		std::string const& _descOrTags,
		SourceLineInfo const& _lineInfo)
	{
		bool isHidden(startsWith(_name, "./")); // Legacy support

												// Parse out tags
		std::set<std::string> tags;
		std::string desc, tag;
		bool inTag = false;
		for (std::size_t i = 0; i < _descOrTags.size(); ++i) {
			char c = _descOrTags[i];
			if (!inTag) {
				if (c == '[')
					inTag = true;
				else
					desc += c;
			}
			else {
				if (c == ']') {
					TestCaseInfo::SpecialProperties prop = parseSpecialTag(tag);
					if (prop == TestCaseInfo::IsHidden)
						isHidden = true;
					else if (prop == TestCaseInfo::None)
						enforceNotReservedTag(tag, _lineInfo);

					tags.insert(tag);
					tag.clear();
					inTag = false;
				}
				else
					tag += c;
			}
		}
		if (isHidden) {
			tags.insert("hide");
			tags.insert(".");
		}

		TestCaseInfo info(_name, _className, desc, tags, _lineInfo);
		return TestCase(_testCase, info);
	}